

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginPopupContextWindow(char *str_id,ImGuiMouseButton mouse_button,bool also_over_items)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id;
  char *str;
  ImGuiContext *g;
  
  str = "window_context";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,str,(char *)0x0);
  pIVar1 = GImGui;
  if ((GImGui->IO).MouseReleased[mouse_button] == true) {
    bVar2 = IsWindowHovered(8);
    if ((bVar2) &&
       ((also_over_items || ((pIVar1->HoveredId == 0 && (pIVar1->HoveredIdPreviousFrame == 0)))))) {
      OpenPopupEx(id);
    }
  }
  bVar2 = BeginPopupEx(id,0x141);
  return bVar2;
}

Assistant:

bool ImGui::BeginPopupContextWindow(const char* str_id, ImGuiMouseButton mouse_button, bool also_over_items)
{
    if (!str_id)
        str_id = "window_context";
    ImGuiID id = GImGui->CurrentWindow->GetID(str_id);
    if (IsMouseReleased(mouse_button) && IsWindowHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        if (also_over_items || !IsAnyItemHovered())
            OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}